

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_object.c
# Opt level: O2

void configuration_object_instantiate(configuration config,value v)

{
  long lVar1;
  long lVar2;
  char *key;
  undefined8 *puVar3;
  long lVar4;
  
  lVar1 = value_type_count(v);
  lVar2 = value_to_map(v);
  for (lVar4 = 0; lVar1 != lVar4; lVar4 = lVar4 + 1) {
    puVar3 = (undefined8 *)value_to_array(*(undefined8 *)(lVar2 + lVar4 * 8));
    key = (char *)value_to_string(*puVar3);
    configuration_object_set(config,key,(value)puVar3[1]);
  }
  config->v = v;
  return;
}

Assistant:

void configuration_object_instantiate(configuration config, value v)
{
	size_t index, size = value_type_count(v);

	value *v_map = value_to_map(v);

	for (index = 0; index < size; ++index)
	{
		value iterator = v_map[index];

		value *tupla = value_to_array(iterator);

		const char *key = value_to_string(tupla[0]);

		configuration_object_set(config, key, tupla[1]);
	}

	config->v = v;
}